

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::copyPointer
          (SegmentBuilder *dstSegment,CapTableBuilder *dstCapTable,WirePointer *dst,
          SegmentReader *srcSegment,CapTableReader *srcCapTable,WirePointer *src,word *srcTarget,
          int nestingLimit,BuilderArena *orphanArena,bool canonical)

{
  WirePointer *pWVar1;
  long lVar2;
  SegmentAnd<capnp::word_*> SVar3;
  StructReader value;
  ListReader value_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ClientHook *pCVar7;
  int iVar8;
  undefined4 extraout_var;
  SegmentBuilder *pSVar10;
  SegmentBuilder *extraout_RAX;
  ulong uVar11;
  SegmentBuilder *extraout_RAX_00;
  SegmentBuilder *extraout_RAX_01;
  SegmentBuilder *extraout_RAX_02;
  SegmentBuilder *extraout_RAX_03;
  SegmentBuilder *pSVar12;
  SegmentBuilder *extraout_RAX_04;
  SegmentBuilder *extraout_RAX_05;
  SegmentBuilder *extraout_RAX_06;
  SegmentBuilder *extraout_RAX_07;
  SegmentBuilder *extraout_RAX_08;
  SegmentBuilder *extraout_RAX_09;
  SegmentBuilder *extraout_RAX_10;
  SegmentBuilder *extraout_RAX_11;
  SegmentBuilder *extraout_RAX_12;
  SegmentBuilder *extraout_RAX_13;
  word *extraout_RDX;
  undefined8 extraout_RDX_00;
  word *extraout_RDX_01;
  word *extraout_RDX_02;
  word *extraout_RDX_03;
  word *pwVar13;
  ulong extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 uVar14;
  word *extraout_RDX_07;
  word *extraout_RDX_08;
  word *extraout_RDX_09;
  word *extraout_RDX_10;
  word *extraout_RDX_11;
  word *extraout_RDX_12;
  word *extraout_RDX_13;
  byte bVar15;
  uint uVar16;
  WirePointer *pWVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  SegmentAnd<capnp::word_*> SVar24;
  Fault f;
  Fault f_2;
  undefined4 uVar25;
  Own<capnp::ClientHook> local_e8;
  int local_d4;
  undefined8 *local_d0;
  CapTableReader *pCStack_c8;
  SegmentBuilder *local_c0;
  uint uStack_b8;
  uint uStack_b4;
  int local_b0;
  undefined4 uStack_ac;
  int iStack_a8;
  undefined4 uStack_a4;
  undefined8 *local_a0;
  CapTableReader *pCStack_98;
  SegmentId *local_90;
  uint uStack_88;
  uint uStack_84;
  int local_80;
  undefined4 uStack_7c;
  int iStack_78;
  undefined4 uStack_74;
  undefined8 *local_70;
  CapTableReader *pCStack_68;
  SegmentBuilder *local_60;
  Arena **ppAStack_58;
  int local_50;
  unsigned_short uStack_4c;
  undefined2 uStack_4a;
  int iStack_48;
  undefined4 uStack_44;
  Fault local_40;
  ClientHook *local_38;
  undefined8 *puVar9;
  
  auVar23._8_8_ = dst;
  auVar23._0_8_ = srcSegment;
  uVar22 = (src->offsetAndKind).value;
  if ((src->field_1).upper32Bits == 0 && uVar22 == 0) goto LAB_00208a13;
  bVar21 = (uVar22 & 3) != 2;
  pSVar12 = (SegmentBuilder *)(ulong)(bVar21 || srcSegment == (SegmentReader *)0x0);
  pWVar17 = src;
  if (!bVar21 && srcSegment != (SegmentReader *)0x0) {
    iVar8 = (*srcSegment->arena->_vptr_Arena[2])();
    puVar9 = (undefined8 *)CONCAT44(extraout_var,iVar8);
    if (puVar9 == (undefined8 *)0x0) {
      copyPointer();
      auVar6._8_8_ = 0;
      auVar6._0_8_ = extraout_RDX_04;
      pSVar12 = extraout_RAX_04;
      srcTarget = (word *)(SegmentBuilder *)0x0;
      auVar23 = auVar6 << 0x40;
    }
    else {
      uVar22 = (src->offsetAndKind).value;
      uVar11 = (ulong)(uVar22 >> 3);
      uVar18 = puVar9[3];
      if ((long)uVar18 < (long)uVar11) {
        uVar11 = uVar18;
      }
      uVar20 = 2 - (ulong)((uVar22 & 4) == 0);
      if (uVar11 + uVar20 <= uVar18) {
        pWVar17 = (WirePointer *)(uVar11 * 8 + puVar9[2]);
        uVar18 = *(ulong *)puVar9[4];
        if (uVar20 <= uVar18) {
          *(ulong *)puVar9[4] = uVar18 - uVar20;
          pWVar1 = pWVar17 + 1;
          if (((src->offsetAndKind).value & 4) == 0) {
            pSVar10 = (SegmentBuilder *)(long)((int)(pWVar17->offsetAndKind).value >> 2);
            lVar2 = puVar9[3];
            auVar5._8_8_ = lVar2;
            auVar5._0_8_ = puVar9;
            auVar4._8_8_ = lVar2;
            auVar4._0_8_ = puVar9;
            auVar23._8_8_ = lVar2;
            auVar23._0_8_ = puVar9;
            srcTarget = (word *)(puVar9[2] + lVar2 * 8);
            pSVar12 = pSVar10;
            if ((puVar9[2] - (long)pWVar1 >> 3 <= (long)pSVar10) &&
               (pSVar12 = (SegmentBuilder *)(pWVar1 + (long)pSVar10), auVar23 = auVar4,
               (long)pSVar10 <= (long)srcTarget - (long)pWVar1 >> 3)) {
              srcTarget = (word *)pSVar12;
              auVar23 = auVar5;
            }
          }
          else {
            auVar23 = (**(code **)(*(long *)*puVar9 + 0x10))
                                ((long *)*puVar9,(pWVar17->field_1).upper32Bits);
            pSVar12 = auVar23._0_8_;
            if (pSVar12 == (SegmentBuilder *)0x0) {
              copyPointer();
              pSVar12 = extraout_RAX_05;
              uVar14 = extraout_RDX_05;
            }
            else {
              uVar22 = (pWVar17->offsetAndKind).value;
              if ((uVar22 & 3) == 2) {
                uVar11 = (ulong)(uVar22 >> 3);
                uVar18 = (pSVar12->super_SegmentReader).ptr.size_;
                if ((long)uVar18 < (long)uVar11) {
                  uVar11 = uVar18;
                }
                pWVar17 = pWVar1;
                srcTarget = (word *)((pSVar12->super_SegmentReader).ptr.ptr + uVar11);
                goto LAB_00208516;
              }
              copyPointer();
              pSVar12 = extraout_RAX_06;
              uVar14 = extraout_RDX_06;
            }
            auVar23._8_8_ = uVar14;
            auVar23._0_8_ = puVar9;
            pWVar17 = pWVar1;
            srcTarget = (word *)(SegmentBuilder *)0x0;
          }
          goto LAB_00208516;
        }
        (**(code **)(*(long *)*puVar9 + 0x18))();
      }
      copyPointer();
      auVar23._8_8_ = extraout_RDX_00;
      auVar23._0_8_ = puVar9;
      pSVar12 = extraout_RAX_00;
      pWVar17 = src;
      srcTarget = (word *)(SegmentBuilder *)0x0;
    }
  }
LAB_00208516:
  pwVar13 = auVar23._8_8_;
  puVar9 = auVar23._0_8_;
  bVar21 = (SegmentBuilder *)srcTarget == (SegmentBuilder *)0x0;
  if (!bVar21) {
    uVar22 = (pWVar17->offsetAndKind).value;
    uVar25 = (undefined4)((ulong)srcCapTable >> 0x20);
    switch(uVar22 & 3) {
    case 0:
      if (nestingLimit < 1) {
        copyPointer();
        pSVar12 = extraout_RAX_08;
        pwVar13 = extraout_RDX_08;
      }
      else {
        if (puVar9 == (undefined8 *)0x0) {
LAB_002085ac:
          ppAStack_58 = &(((SegmentBuilder *)srcTarget)->super_SegmentReader).arena +
                        *(ushort *)&pWVar17->field_1;
          local_50 = (uint)*(ushort *)&pWVar17->field_1 << 6;
          uStack_4c = (pWVar17->field_1).structRef.ptrCount.value;
          iStack_48 = nestingLimit + -1;
          value.capTable._0_4_ = (int)srcCapTable;
          value.segment = (SegmentReader *)puVar9;
          value.capTable._4_4_ = uVar25;
          value.data._0_4_ = (int)srcTarget;
          value.data._4_4_ = (int)((ulong)srcTarget >> 0x20);
          value.pointers._0_4_ = (int)ppAStack_58;
          value.pointers._4_4_ = (int)((ulong)ppAStack_58 >> 0x20);
          value.dataSize = local_50;
          value._36_4_ = (int)(CONCAT26(uStack_4a,CONCAT24(uStack_4c,local_50)) >> 0x20);
          value.nestingLimit = iStack_48;
          value._44_4_ = uStack_44;
          local_70 = puVar9;
          pCStack_68 = srcCapTable;
          local_60 = (SegmentBuilder *)srcTarget;
          SVar24 = setStructPointer(dstSegment,dstCapTable,dst,value,orphanArena,canonical);
LAB_002089a0:
          bVar21 = false;
          goto LAB_00208a0e;
        }
        uVar18 = (ulong)(pWVar17->field_1).structRef.dataSize.value +
                 (ulong)(pWVar17->field_1).structRef.ptrCount.value;
        if (((long)srcTarget - puVar9[2] >> 3) + uVar18 <= (ulong)puVar9[3]) {
          uVar11 = *(ulong *)puVar9[4];
          if (uVar18 <= uVar11) {
            *(ulong *)puVar9[4] = uVar11 - uVar18;
            goto LAB_002085ac;
          }
          (**(code **)(*(long *)*puVar9 + 0x18))();
        }
        copyPointer();
        pSVar12 = extraout_RAX_01;
        pwVar13 = extraout_RDX_01;
      }
      break;
    case 1:
      if (nestingLimit < 1) {
        copyPointer();
        pSVar12 = extraout_RAX_09;
        pwVar13 = extraout_RDX_09;
      }
      else {
        uVar22 = (pWVar17->field_1).upper32Bits;
        bVar15 = (byte)uVar22 & 7;
        if (bVar15 == 7) {
          uVar18 = (ulong)(uVar22 >> 3);
          if (puVar9 == (undefined8 *)0x0) {
LAB_00208791:
            uVar22 = *(uint *)&(((SegmentBuilder *)srcTarget)->super_SegmentReader).arena;
            if ((uVar22 & 3) == 0) {
              uVar16 = uVar22 >> 2 & 0x1fffffff;
              uVar11 = (ulong)uVar16;
              uVar19 = (uint)*(ushort *)
                              ((long)&(((SegmentBuilder *)srcTarget)->super_SegmentReader).arena + 6
                              ) +
                       (uint)*(ushort *)
                              ((long)&(((SegmentBuilder *)srcTarget)->super_SegmentReader).arena + 4
                              );
              if (uVar19 * uVar11 < uVar18 || uVar19 * uVar11 - uVar18 == 0) {
                if ((puVar9 != (undefined8 *)0x0) && (uVar19 == 0)) {
                  uVar18 = *(ulong *)puVar9[4];
                  if (uVar18 < uVar11) {
                    (**(code **)(*(long *)*puVar9 + 0x18))();
                    copyPointer();
                    pSVar12 = extraout_RAX_13;
                    pwVar13 = extraout_RDX_13;
                    break;
                  }
                  *(ulong *)puVar9[4] = uVar18 - uVar11;
                }
                local_90 = &(((SegmentBuilder *)srcTarget)->super_SegmentReader).id;
                uVar19 = uVar19 * 0x40;
                iVar8 = (uint)*(ushort *)
                               ((long)&(((SegmentBuilder *)srcTarget)->super_SegmentReader).arena +
                               4) << 6;
                iStack_78 = nestingLimit + -1;
                uStack_7c._0_3_ =
                     CONCAT12(7,*(undefined2 *)
                                 ((long)&(((SegmentBuilder *)srcTarget)->super_SegmentReader).arena
                                 + 6));
                uVar22 = uStack_7c;
                local_a0 = puVar9;
                pCStack_98 = srcCapTable;
                uStack_88 = uVar16;
                uStack_84 = uVar19;
                local_80 = iVar8;
                srcTarget = (word *)local_90;
                goto LAB_00208973;
              }
              copyPointer();
              pSVar12 = extraout_RAX_11;
              pwVar13 = extraout_RDX_11;
            }
            else {
              copyPointer();
              pSVar12 = extraout_RAX_10;
              pwVar13 = extraout_RDX_10;
            }
          }
          else {
            if (((long)srcTarget - puVar9[2] >> 3) + uVar18 + 1 <= (ulong)puVar9[3]) {
              uVar11 = *(ulong *)puVar9[4];
              if (uVar18 + 1 <= uVar11) {
                *(ulong *)puVar9[4] = uVar11 - (uVar18 + 1);
                goto LAB_00208791;
              }
              (**(code **)(*(long *)*puVar9 + 0x18))();
            }
            copyPointer();
            pSVar12 = extraout_RAX_02;
            pwVar13 = extraout_RDX_02;
          }
        }
        else {
          iVar8 = *(int *)(BITS_PER_ELEMENT_TABLE + (ulong)bVar15 * 4);
          uVar19 = (uint)(bVar15 == 6) * 0x40 + iVar8;
          uVar16 = uVar22 >> 3;
          uVar18 = (ulong)uVar16;
          local_d4 = iVar8;
          if (puVar9 == (undefined8 *)0x0) {
LAB_002088e2:
            if ((puVar9 != (undefined8 *)0x0) && ((uVar22 & 7) == 0)) {
              uVar11 = *(ulong *)puVar9[4];
              if (uVar11 < uVar18) {
                (**(code **)(*(long *)*puVar9 + 0x18))();
                copyPointer();
                pSVar12 = extraout_RAX_12;
                pwVar13 = extraout_RDX_12;
                break;
              }
              *(ulong *)puVar9[4] = uVar11 - uVar18;
            }
            iStack_a8 = nestingLimit + -1;
            uStack_ac = CONCAT13(uStack_ac._3_1_,CONCAT12((byte)uVar22,(ushort)(bVar15 == 6))) &
                        0xff07ffff;
            uVar22 = uStack_ac;
            uStack_74 = uStack_a4;
            local_d0 = puVar9;
            pCStack_c8 = srcCapTable;
            local_c0 = (SegmentBuilder *)srcTarget;
            uStack_b8 = uVar16;
            uStack_b4 = uVar19;
            local_b0 = iVar8;
LAB_00208973:
            value_00.capTable._0_4_ = (int)srcCapTable;
            value_00.segment = (SegmentReader *)puVar9;
            value_00.capTable._4_4_ = uVar25;
            value_00.ptr._0_4_ = (int)srcTarget;
            value_00.ptr._4_4_ = (int)((ulong)srcTarget >> 0x20);
            value_00.elementCount = uVar16;
            value_00.step = uVar19;
            value_00.structDataSize = iVar8;
            value_00.structPointerCount = (short)uVar22;
            value_00.elementSize = (char)(uVar22 >> 0x10);
            value_00._39_1_ = (char)(uVar22 >> 0x18);
            value_00.nestingLimit = nestingLimit + -1;
            value_00._44_4_ = uStack_74;
            SVar24 = setListPointer(dstSegment,dstCapTable,dst,value_00,orphanArena,canonical);
            goto LAB_002089a0;
          }
          uVar11 = uVar19 * uVar18 + 0x3f >> 6 & 0xffffffff;
          if (((long)srcTarget - puVar9[2] >> 3) + uVar11 <= (ulong)puVar9[3]) {
            uVar20 = *(ulong *)puVar9[4];
            if (uVar11 <= uVar20) {
              *(ulong *)puVar9[4] = uVar20 - uVar11;
              goto LAB_002088e2;
            }
            (**(code **)(*(long *)*puVar9 + 0x18))();
          }
          copyPointer();
          pSVar12 = extraout_RAX_03;
          pwVar13 = extraout_RDX_03;
        }
      }
      break;
    case 2:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                ((Fault *)&local_e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x7fe,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                 (char (*) [24])"Unexpected FAR pointer.");
      kj::_::Debug::Fault::~Fault((Fault *)&local_e8);
      pSVar12 = extraout_RAX;
      pwVar13 = extraout_RDX;
LAB_00208677:
      bVar21 = true;
      goto LAB_0020867a;
    case 3:
      if (uVar22 != 3) {
        copyPointer();
        pSVar12 = extraout_RAX_07;
        pwVar13 = extraout_RDX_07;
        goto LAB_00208677;
      }
      if (canonical) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[52]>
                  ((Fault *)&local_e8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x808,FAILED,(char *)0x0,
                   "\"Cannot create a canonical message with a capability\"",
                   (char (*) [52])"Cannot create a canonical message with a capability");
        kj::_::Debug::Fault::~Fault((Fault *)&local_e8);
      }
      (**srcCapTable->_vptr_CapTableReader)
                (&local_40,srcCapTable,(ulong)(pWVar17->field_1).upper32Bits);
      local_e8.disposer = (Disposer *)local_40.exception;
      local_e8.ptr = local_38;
      bVar21 = local_38 == (ClientHook *)0x0;
      if (bVar21) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                  (&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x813,FAILED,(char *)0x0,"\"Message contained invalid capability pointer.\"",
                   (char (*) [46])"Message contained invalid capability pointer.");
        kj::_::Debug::Fault::~Fault(&local_40);
      }
      else {
        setCapabilityPointer(dstSegment,dstCapTable,dst,&local_e8);
      }
      pCVar7 = local_e8.ptr;
      if (local_e8.ptr != (ClientHook *)0x0) {
        local_e8.ptr = (ClientHook *)0x0;
        (**(_func_int **)(((String *)&(local_e8.disposer)->_vptr_Disposer)->content).ptr)
                  (local_e8.disposer,pCVar7->_vptr_ClientHook[-2] + (long)&pCVar7->_vptr_ClientHook)
        ;
      }
      SVar24.value = (word *)0x1;
      SVar24.segment = dstSegment;
      goto LAB_00208a0e;
    }
    bVar21 = true;
  }
LAB_0020867a:
  SVar24.value = pwVar13;
  SVar24.segment = pSVar12;
LAB_00208a0e:
  if (!bVar21) {
    return SVar24;
  }
LAB_00208a13:
  if ((dst->field_1).upper32Bits != 0 || (dst->offsetAndKind).value != 0) {
    zeroObject(dstSegment,dstCapTable,dst);
    dst->offsetAndKind = 0;
    dst->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  SVar3.value = (word *)0x0;
  SVar3.segment = dstSegment;
  return SVar3;
}

Assistant:

static SegmentAnd<word*> copyPointer(
      SegmentBuilder* dstSegment, CapTableBuilder* dstCapTable, WirePointer* dst,
      SegmentReader* srcSegment, CapTableReader* srcCapTable, const WirePointer* src,
      const word* srcTarget, int nestingLimit,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    // Deep-copy the object pointed to by src into dst.  It turns out we can't reuse
    // readStructPointer(), etc. because they do type checking whereas here we want to accept any
    // valid pointer.

    if (src->isNull()) {
    useDefault:
      if (!dst->isNull()) {
        zeroObject(dstSegment, dstCapTable, dst);
        zeroMemory(dst);
      }
      return { dstSegment, nullptr };
    }

    const word* ptr;
    KJ_IF_MAYBE(p, WireHelpers::followFars(src, srcTarget, srcSegment)) {
      ptr = p;
    } else {
      goto useDefault;
    }

    switch (src->kind()) {
      case WirePointer::STRUCT:
        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        KJ_REQUIRE(boundsCheck(srcSegment, ptr, src->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer.") {
          goto useDefault;
        }
        return setStructPointer(dstSegment, dstCapTable, dst,
            StructReader(srcSegment, srcCapTable, ptr,
                         reinterpret_cast<const WirePointer*>(ptr + src->structRef.dataSize.get()),
                         src->structRef.dataSize.get() * BITS_PER_WORD,
                         src->structRef.ptrCount.get(),
                         nestingLimit - 1),
            orphanArena, canonical);

      case WirePointer::LIST: {
        ElementSize elementSize = src->listRef.elementSize();

        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        if (elementSize == ElementSize::INLINE_COMPOSITE) {
          auto wordCount = src->listRef.inlineCompositeWordCount();
          const WirePointer* tag = reinterpret_cast<const WirePointer*>(ptr);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                     "Message contains out-of-bounds list pointer.") {
            goto useDefault;
          }

          ptr += POINTER_SIZE_IN_WORDS;

          KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
                     "INLINE_COMPOSITE lists of non-STRUCT type are not supported.") {
            goto useDefault;
          }

          auto elementCount = tag->inlineCompositeListElementCount();
          auto wordsPerElement = tag->structRef.wordSize() / ELEMENTS;

          KJ_REQUIRE(wordsPerElement * upgradeBound<uint64_t>(elementCount) <= wordCount,
                     "INLINE_COMPOSITE list's elements overrun its word count.") {
            goto useDefault;
          }

          if (wordsPerElement * (ONE * ELEMENTS) == ZERO * WORDS) {
            // Watch out for lists of zero-sized structs, which can claim to be arbitrarily large
            // without having sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr,
                         elementCount, wordsPerElement * BITS_PER_WORD,
                         tag->structRef.dataSize.get() * BITS_PER_WORD,
                         tag->structRef.ptrCount.get(), ElementSize::INLINE_COMPOSITE,
                         nestingLimit - 1),
              orphanArena, canonical);
        } else {
          auto dataSize = dataBitsPerElement(elementSize) * ELEMENTS;
          auto pointerCount = pointersPerElement(elementSize) * ELEMENTS;
          auto step = (dataSize + pointerCount * BITS_PER_POINTER) / ELEMENTS;
          auto elementCount = src->listRef.elementCount();
          auto wordCount = roundBitsUpToWords(upgradeBound<uint64_t>(elementCount) * step);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount),
                     "Message contains out-of-bounds list pointer.") {
            goto useDefault;
          }

          if (elementSize == ElementSize::VOID) {
            // Watch out for lists of void, which can claim to be arbitrarily large without having
            // sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr, elementCount, step, dataSize, pointerCount,
                         elementSize, nestingLimit - 1),
              orphanArena, canonical);
        }
      }

      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          goto useDefault;
        }

      case WirePointer::OTHER: {
        KJ_REQUIRE(src->isCapability(), "Unknown pointer type.") {
          goto useDefault;
        }

        if (canonical) {
          KJ_FAIL_REQUIRE("Cannot create a canonical message with a capability") {
            break;
          }
        }
#if !CAPNP_LITE
        KJ_IF_MAYBE(cap, srcCapTable->extractCap(src->capRef.index.get())) {
          setCapabilityPointer(dstSegment, dstCapTable, dst, kj::mv(*cap));
          // Return dummy non-null pointer so OrphanBuilder doesn't end up null.
          return { dstSegment, reinterpret_cast<word*>(1) };
        } else {
#endif  // !CAPNP_LITE
          KJ_FAIL_REQUIRE("Message contained invalid capability pointer.") {
            goto useDefault;
          }
#if !CAPNP_LITE
        }
#endif  // !CAPNP_LITE
      }
    }

    KJ_UNREACHABLE;
  }